

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O1

shared_ptr<Storage::Disk::Track>
Storage::Encodings::MFM::TrackWithSectors
          (Density density,
          vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
          *sectors,optional<unsigned_long> sector_gap_length,
          optional<unsigned_char> sector_gap_filler_byte)

{
  bool bVar1;
  undefined4 in_register_0000003c;
  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  *sectors_00;
  uint in_R9D;
  uint uVar3;
  uint8_t uVar4;
  shared_ptr<Storage::Disk::Track> sVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  sectors_00 = (vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                *)CONCAT44(in_register_0000003c,density);
  bVar1 = sector_gap_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged;
  if ((int)sectors == 1) {
    uVar3 = in_R9D & 0xff;
    if ((in_R9D >> 8 & 1) == 0) {
      uVar3 = 0x4e;
    }
    uVar4 = '6';
    if (((ushort)sector_gap_filler_byte.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_char> & 1) != 0) {
      uVar4 = bVar1;
    }
  }
  else {
    if ((int)sectors != 2) {
      uVar3 = in_R9D & 0xff;
      if ((in_R9D >> 8 & 1) == 0) {
        uVar3 = 0xff;
      }
      uVar4 = '\x1b';
      if (((ushort)sector_gap_filler_byte.super__Optional_base<unsigned_char,_true,_true>._M_payload
                   .super__Optional_payload_base<unsigned_char> & 1) != 0) {
        uVar4 = bVar1;
      }
      sVar5 = GTrackWithSectors<FMEncoder>
                        (sectors_00,
                         sector_gap_length.super__Optional_base<unsigned_long,_true,_true>.
                         _M_payload.super__Optional_payload_base<unsigned_long>._M_payload,'\x1a',
                         0xff,6,'\v',(ulong)uVar3,6,uVar4,0xff);
      _Var2 = sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      goto LAB_00444565;
    }
    uVar3 = in_R9D & 0xff;
    if ((in_R9D >> 8 & 1) == 0) {
      uVar3 = 0x4e;
    }
    uVar4 = '6';
    if (((ushort)sector_gap_filler_byte.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_char> & 1) != 0) {
      uVar4 = bVar1;
    }
  }
  sVar5 = GTrackWithSectors<MFMEncoder>
                    (sectors_00,
                     sector_gap_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_long>._M_payload,'2',0x4e,0xc,'\x16',
                     (ulong)uVar3,0xc,uVar4,0xff);
  _Var2 = sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
LAB_00444565:
  sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)sectors_00;
  return (shared_ptr<Storage::Disk::Track>)
         sVar5.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Storage::Disk::Track> Storage::Encodings::MFM::TrackWithSectors(
	Density density,
	const std::vector<const Sector *> &sectors,
	std::optional<std::size_t> sector_gap_length,
	std::optional<uint8_t> sector_gap_filler_byte
) {
	switch(density) {
		default:
		case Density::Single:	return TTrackWithSectors<Density::Single>(sectors, sector_gap_length, sector_gap_filler_byte);
		case Density::Double:	return TTrackWithSectors<Density::Double>(sectors, sector_gap_length, sector_gap_filler_byte);
		case Density::High:		return TTrackWithSectors<Density::High>(sectors, sector_gap_length, sector_gap_filler_byte);
	}
}